

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

bool __thiscall
google::protobuf::anon_unknown_0::TestIgnorer::IsIgnored
          (TestIgnorer *this,Message *message1,Message *message2,FieldDescriptor *field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  ushort *puVar1;
  _Alloc_hider __s1;
  int iVar2;
  pointer pSVar3;
  ulong uVar4;
  long lVar5;
  size_type __rlen;
  bool bVar6;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  FieldDescriptor *local_98;
  AlphaNum local_90;
  AlphaNum local_60;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_98 = field;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,anon_var_dwarf_a12c75 + 5);
  pSVar3 = (parent_fields->
           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((parent_fields->
      super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      )._M_impl.super__Vector_impl_data._M_finish != pSVar3) {
    lVar5 = 0x18;
    uVar4 = 0;
    do {
      puVar1 = *(ushort **)(*(long *)((long)&pSVar3->message1 + lVar5) + 8);
      local_90.piece_._M_len = (size_t)*puVar1;
      local_90.piece_._M_str = (char *)(~local_90.piece_._M_len + (long)puVar1);
      local_60.piece_._M_len = 1;
      local_60.piece_._M_str = ".";
      absl::lts_20250127::StrAppend(&local_b8,&local_90,&local_60);
      uVar4 = uVar4 + 1;
      pSVar3 = (parent_fields->
               super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x60;
    } while (uVar4 < (ulong)(((long)(parent_fields->
                                    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 5)
                            * -0x5555555555555555));
  }
  puVar1 = (ushort *)(local_98->all_names_).payload_;
  local_90.piece_._M_len = (size_t)*puVar1;
  local_90.piece_._M_str = (char *)((long)puVar1 + ~local_90.piece_._M_len);
  absl::lts_20250127::StrAppend(&local_b8,&local_90);
  __s1._M_p = local_b8._M_dataplus._M_p;
  bVar6 = true;
  lVar5 = 0;
  do {
    if (local_b8._M_string_length ==
        *(size_t *)((long)&protobuf::(anonymous_namespace)::kIgnoredFields + lVar5)) {
      if (local_b8._M_string_length == 0) break;
      iVar2 = bcmp(__s1._M_p,*(void **)((long)&PTR_anon_var_dwarf_3083b57_019511b8 + lVar5),
                   local_b8._M_string_length);
      if (iVar2 == 0) break;
    }
    lVar5 = lVar5 + 0x10;
    bVar6 = lVar5 == 0x10;
  } while (bVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool IsIgnored(const Message& message1, const Message& message2,
                 const FieldDescriptor* field,
                 const std::vector<util::MessageDifferencer::SpecificField>&
                     parent_fields) override {
    std::string name = "";
    for (size_t i = 0; i < parent_fields.size(); ++i) {
      absl::StrAppend(&name, parent_fields[i].field->name(), ".");
    }
    absl::StrAppend(&name, field->name());
    for (size_t i = 0; i < ABSL_ARRAYSIZE(kIgnoredFields); ++i) {
      if (name == kIgnoredFields[i]) {
        return true;
      }
    }
    return false;
  }